

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_mem_destroy(void)

{
  int iVar1;
  anon_struct_32_4_90625080 *local_20;
  fio_ls_embd_s *node;
  size_t count;
  size_t i;
  
  if (arenas != (arena_s *)0x0) {
    for (count = 0; count < memory.cores; count = count + 1) {
      if (arenas[count].block != (block_s *)0x0) {
        block_free(arenas[count].block);
      }
      arenas[count].block = (block_s *)0x0;
    }
    if ((memory.forked == '\0') && (iVar1 = fio_ls_embd_any(&memory.available), iVar1 != 0)) {
      if (2 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "WARNING: facil.io detected memory traces remaining after cleanup - memory leak?"
                      );
      }
      node = (fio_ls_embd_s *)0x0;
      for (local_20 = (anon_struct_32_4_90625080 *)memory.available.next; local_20 != &memory;
          local_20 = (anon_struct_32_4_90625080 *)(local_20->available).next) {
        node = (fio_ls_embd_s *)((long)&node->prev + 1);
      }
      if (4 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7328): Memory blocks in pool: %zu (%zu blocks per allocation)."
                       ,node,0x100);
      }
    }
    big_free(arenas);
    arenas = (arena_s *)0x0;
  }
  return;
}

Assistant:

static void fio_mem_destroy(void) {
  if (!arenas)
    return;

  FIO_MEMORY_PRINT_BLOCK_STAT();

  for (size_t i = 0; i < memory.cores; ++i) {
    if (arenas[i].block)
      block_free(arenas[i].block);
    arenas[i].block = NULL;
  }
  if (!memory.forked && fio_ls_embd_any(&memory.available)) {
    FIO_LOG_WARNING("facil.io detected memory traces remaining after cleanup"
                    " - memory leak?");
    FIO_MEMORY_PRINT_BLOCK_STAT_END();
    size_t count = 0;
    FIO_LS_EMBD_FOR(&memory.available, node) { ++count; }
    FIO_LOG_DEBUG("Memory blocks in pool: %zu (%zu blocks per allocation).",
                  count, (size_t)FIO_MEMORY_BLOCKS_PER_ALLOCATION);
#if FIO_MEM_DUMP
    fio_memory_dump_missing();
#endif
  }
  big_free(arenas);
  arenas = NULL;
}